

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::ToYa::ToYa
          (ToYa *this,TiledOutputFile *outputFile,RgbaChannels rgbaChannels)

{
  uint in_EDX;
  TiledOutputFile *in_RSI;
  long in_RDI;
  Array2D<Imf_3_4::Rgba> *unaff_retaddr;
  TileDescription *td;
  Vec3<float> local_38 [2];
  TileDescription *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  long sizeX;
  
  sizeX = in_RDI;
  std::mutex::mutex((mutex *)0x24a991);
  *(TiledOutputFile **)(in_RDI + 0x28) = in_RSI;
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)(in_RDI + 0x3c));
  Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48));
  *(char *)(in_RDI + 0x30) = (char)((in_EDX & 8) >> 3);
  TiledOutputFile::header(in_RSI);
  local_20 = Header::tileDescription((Header *)0x24a9e8);
  *(uint *)(in_RDI + 0x34) = local_20->xSize;
  *(uint *)(in_RDI + 0x38) = local_20->ySize;
  TiledOutputFile::header(*(TiledOutputFile **)(in_RDI + 0x28));
  anon_unknown_23::ywFromHeader((Header *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  Imath_3_2::Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x3c),local_38);
  Array2D<Imf_3_4::Rgba>::resizeErase(unaff_retaddr,sizeX,(long)in_RSI);
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  return;
}

Assistant:

TiledRgbaOutputFile::ToYa::ToYa (
    TiledOutputFile& outputFile, RgbaChannels rgbaChannels)
    : _outputFile (outputFile)
{
    _writeA = (rgbaChannels & WRITE_A) ? true : false;

    const TileDescription& td = outputFile.header ().tileDescription ();

    _tileXSize = td.xSize;
    _tileYSize = td.ySize;
    _yw        = ywFromHeader (_outputFile.header ());
    _buf.resizeErase (_tileYSize, _tileXSize);
    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}